

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_forest.hpp
# Opt level: O2

void __thiscall
pico_tree::
kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
::
search_nearest<pico_tree::internal::point_wrapper<std::array<float,784ul>>,pico_tree::internal::search_nn<pico_tree::neighbor<int,float>>>
          (kd_forest<std::reference_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>const>,pico_tree::metric_l2_squared,int>
           *this,point_type *point,size_t max_leaves_visited,
          search_nn<pico_tree::neighbor<int,_float>_> *visitor)

{
  ulong uVar1;
  long lVar2;
  point<float,_784UL> p;
  point_wrapper<std::array<float,_784UL>_> local_cc8;
  priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  local_cc0;
  point<float,_784UL> local_c70;
  
  lVar2 = 0;
  local_cc8.point_ = point;
  for (uVar1 = 0; uVar1 < (ulong)((*(long *)(this + 0x18) - *(long *)(this + 0x10)) / 0x2520);
      uVar1 = uVar1 + 1) {
    internal::rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>::
    rotate_point<pico_tree::internal::point_wrapper<std::array<float,784ul>>>
              (&local_c70,
               (rkd_tree_hh_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul> *)
               (*(long *)(this + 0x10) + lVar2),&local_cc8);
    local_cc0.space_.space_ = (space_type *)(*(long *)(this + 0x10) + lVar2 + 0xc40);
    local_cc0.indices_ =
         (vector<int,_std::allocator<int>_> *)(*(long *)(this + 0x10) + 0xc60 + lVar2);
    local_cc0.queue_.c.
    super__Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_cc0.queue_.c.
    super__Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_cc0.queue_.c.
    super__Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cc0.query_.point_ = &local_c70;
    local_cc0.max_leaves_visited_ = max_leaves_visited;
    local_cc0.visitor_ = visitor;
    internal::
    priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_784UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
    ::operator()(&local_cc0,
                 (node_type *)
                 local_cc0.indices_[0x107].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::
    _Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>,_std::allocator<std::pair<float,_const_pico_tree::internal::kd_tree_node_topological<int,_float>_*>_>_>
                     *)&local_cc0.queue_);
    lVar2 = lVar2 + 0x2520;
  }
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point,
      size_type max_leaves_visited,
      Visitor_& visitor,
      euclidean_space_tag) const {
    // Range based for loop (rightfully) results in a warning that shouldn't be
    // needed if the user creates the forest with at least a single tree.
    for (std::size_t i = 0; i < data_.size(); ++i) {
      auto p = data_[i].rotate_point(point);
      using point_wrapper_type = internal::point_wrapper<decltype(p)>;
      point_wrapper_type point_wrapper(p);
      internal::priority_search_nearest_euclidean<
          typename rkd_tree_data_type::space_wrapper_type,
          Metric_,
          point_wrapper_type,
          Visitor_,
          index_type>(
          typename rkd_tree_data_type::space_wrapper_type(data_[i].space),
          metric_,
          data_[i].tree.indices,
          point_wrapper,
          max_leaves_visited,
          visitor)(data_[i].tree.root_node);
    }
  }